

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

RTCBuffer rtcNewSharedBuffer(RTCDevice hdevice,void *ptr,size_t byteSize)

{
  int iVar1;
  Buffer *this;
  undefined4 extraout_var;
  undefined8 *puVar2;
  allocator local_49;
  DeviceEnterLeave enterleave;
  
  if (hdevice != (RTCDevice)0x0) {
    embree::DeviceEnterLeave::DeviceEnterLeave(&enterleave,hdevice);
    this = (Buffer *)operator_new(0x30);
    embree::Buffer::Buffer(this,(Device *)hdevice,byteSize,ptr);
    iVar1 = (*(this->super_RefCount)._vptr_RefCount[2])(this);
    embree::DeviceEnterLeave::~DeviceEnterLeave(&enterleave);
    return (RTCBuffer)CONCAT44(extraout_var,iVar1);
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&enterleave,"invalid argument",&local_49);
  *puVar2 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar2 + 1) = 2;
  std::__cxx11::string::string((string *)(puVar2 + 2),(string *)&enterleave);
  __cxa_throw(puVar2,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API RTCBuffer rtcNewSharedBuffer(RTCDevice hdevice, void* ptr, size_t byteSize)
  {
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcNewSharedBuffer);
    RTC_VERIFY_HANDLE(hdevice);
    RTC_ENTER_DEVICE(hdevice);
    Buffer* buffer = new Buffer((Device*)hdevice, byteSize, ptr);
    return (RTCBuffer)buffer->refInc();
    RTC_CATCH_END((Device*)hdevice);
    return nullptr;
  }